

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O0

obj * pick_obj(obj *otmp)

{
  boolean bVar1;
  char *pcVar2;
  obj *poVar3;
  char local_17 [7];
  char fakeshop [2];
  obj *poStack_10;
  char saveushops [5];
  obj *otmp_local;
  
  poStack_10 = otmp;
  obj_extract_self(otmp);
  if ((((u._1052_1_ & 1) == 0) && (poStack_10 != uball)) &&
     (bVar1 = costly_spot(poStack_10->ox,poStack_10->oy), bVar1 != '\0')) {
    strcpy(local_17 + 2,u.ushops);
    pcVar2 = in_rooms(level,poStack_10->ox,poStack_10->oy,0x12);
    local_17[0] = *pcVar2;
    local_17[1] = 0;
    strcpy(u.ushops,local_17);
    addtobill(poStack_10,'\x01','\0','\0');
    strcpy(u.ushops,local_17 + 2);
    pcVar2 = strchr(u.ushops,(int)local_17[0]);
    if (pcVar2 == (char *)0x0) {
      remote_burglary(poStack_10->ox,poStack_10->oy);
    }
  }
  if ((*(uint *)&poStack_10->field_0x4a >> 3 & 1) != 0) {
    *(uint *)&poStack_10->field_0x4a = *(uint *)&poStack_10->field_0x4a & 0xfffffff7;
  }
  newsym((int)poStack_10->ox,(int)poStack_10->oy);
  poVar3 = addinv(poStack_10);
  return poVar3;
}

Assistant:

struct obj *pick_obj(struct obj *otmp)
{
	obj_extract_self(otmp);
	if (!u.uswallow && otmp != uball && costly_spot(otmp->ox, otmp->oy)) {
	    char saveushops[5], fakeshop[2];

	    /* addtobill cares about your location rather than the object's;
	       usually they'll be the same, but not when using telekinesis
	       (if ever implemented) or a grappling hook */
	    strcpy(saveushops, u.ushops);
	    fakeshop[0] = *in_rooms(level, otmp->ox, otmp->oy, SHOPBASE);
	    fakeshop[1] = '\0';
	    strcpy(u.ushops, fakeshop);
	    /* sets obj->unpaid if necessary */
	    addtobill(otmp, TRUE, FALSE, FALSE);
	    strcpy(u.ushops, saveushops);
	    /* if you're outside the shop, make shk notice */
	    if (!strchr(u.ushops, *fakeshop))
		remote_burglary(otmp->ox, otmp->oy);
	}
	if (otmp->no_charge)	/* only applies to objects outside invent */
	    otmp->no_charge = 0;
	newsym(otmp->ox, otmp->oy);
	return addinv(otmp);	/* might merge it with other objects */
}